

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::anon_unknown_123::PromisedAsyncOutputStream::tryPumpFrom
          (PromisedAsyncOutputStream *this,AsyncInputStream *input,uint64_t amount)

{
  _func_int **pp_Var1;
  SourceLocation location;
  OwnPromiseNode OVar2;
  void *pvVar3;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 aVar4;
  ForkHub<kj::_::Void> *location_00;
  Maybe<kj::Promise<unsigned_long>_> MVar5;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  ForkedPromise<void> local_88;
  code *local_78;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_70;
  OwnPromiseNode local_68;
  anon_class_24_3_e7c12ea1_for_func local_60;
  undefined *local_48;
  undefined *puStack_40;
  undefined8 local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_30;
  
  pp_Var1 = input[4]._vptr_AsyncInputStream;
  if (pp_Var1 == (_func_int **)0x0) {
    ForkedPromise<void>::addBranch(&local_88);
    local_78 = kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2532:39)>
               ::anon_class_24_3_e7c12ea1_for_func::operator();
    pp_Var1 = local_88.hub.disposer[1]._vptr_Disposer;
    local_60.this = (PromisedAsyncOutputStream *)input;
    local_60.input = (AsyncInputStream *)amount;
    if (pp_Var1 == (_func_int **)0x0 || (ulong)((long)local_88.hub.disposer - (long)pp_Var1) < 0x38)
    {
      pvVar3 = operator_new(0x400);
      location_00 = (ForkHub<kj::_::Void> *)((long)pvVar3 + 0x3c8);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::PromisedAsyncOutputStream::tryPumpFrom(kj::AsyncInputStream&,unsigned_long)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PromisedAsyncOutputStream::tryPumpFrom(kj::AsyncInputStream&,unsigned_long)::_lambda()_1_,void*&>
                ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2532:39)>
                  *)location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_88,
                 &local_60,&local_78);
      *(void **)((long)pvVar3 + 0x3d0) = pvVar3;
    }
    else {
      local_88.hub.disposer[1]._vptr_Disposer = (_func_int **)0x0;
      location_00 = (ForkHub<kj::_::Void> *)(local_88.hub.disposer + -7);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::PromisedAsyncOutputStream::tryPumpFrom(kj::AsyncInputStream&,unsigned_long)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PromisedAsyncOutputStream::tryPumpFrom(kj::AsyncInputStream&,unsigned_long)::_lambda()_1_,void*&>
                ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2532:39)>
                  *)location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_88,
                 &local_60,&local_78);
      local_88.hub.disposer[-6]._vptr_Disposer = pp_Var1;
    }
    local_48 = &DAT_0042a172;
    puStack_40 = &DAT_0042a1d1;
    local_38 = 0x4c0000058b;
    location.function = &DAT_0042a1d1;
    location.fileName = &DAT_0042a172;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    local_88.hub.ptr = location_00;
    kj::_::maybeChain<unsigned_long>(&local_68,(Promise<unsigned_long> *)&local_88.hub.ptr,location)
    ;
    OVar2.ptr = local_68.ptr;
    local_68.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_68);
    local_70.ptr = OVar2.ptr;
    local_30.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_30);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_88.hub.ptr);
    *(undefined1 *)&(this->super_AsyncOutputStream)._vptr_AsyncOutputStream = 1;
    (this->promise).hub.disposer = (Disposer *)OVar2.ptr;
    local_70.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_70);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_88);
    aVar4 = extraout_RDX_00;
  }
  else {
    (**(code **)(*pp_Var1 + 0x10))(this,pp_Var1,amount);
    aVar4 = extraout_RDX;
  }
  MVar5.ptr.field_1 = aVar4;
  MVar5.ptr._0_8_ = this;
  return (Maybe<kj::Promise<unsigned_long>_>)MVar5.ptr;
}

Assistant:

kj::Maybe<kj::Promise<uint64_t>> tryPumpFrom(
      kj::AsyncInputStream& input, uint64_t amount = kj::maxValue) override {
    KJ_IF_SOME(s, stream) {
      return s->tryPumpFrom(input, amount);
    } else {
      return promise.addBranch().then([this,&input,amount]() {
        // Call input.pumpTo() on the resolved stream instead.
        return input.pumpTo(*KJ_ASSERT_NONNULL(stream), amount);
      });
    }
  }